

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_exporter.cpp
# Opt level: O0

void Assimp::Write(JSONWriter *out,aiLight *ai,bool is_elem)

{
  aiLight *paVar1;
  allocator<char> local_209;
  string local_208;
  allocator<char> local_1e1;
  string local_1e0;
  allocator<char> local_1b9;
  string local_1b8;
  allocator<char> local_191;
  string local_190;
  allocator<char> local_169;
  string local_168;
  allocator<char> local_141;
  string local_140;
  allocator<char> local_119;
  string local_118;
  allocator<char> local_f1;
  string local_f0;
  allocator<char> local_c9;
  string local_c8;
  allocator<char> local_a1;
  string local_a0;
  allocator<char> local_79;
  string local_78;
  allocator<char> local_41;
  string local_40;
  undefined1 local_19;
  aiLight *paStack_18;
  bool is_elem_local;
  aiLight *ai_local;
  JSONWriter *out_local;
  
  local_19 = is_elem;
  paStack_18 = ai;
  ai_local = (aiLight *)out;
  JSONWriter::StartObj(out,is_elem);
  paVar1 = ai_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"name",&local_41);
  JSONWriter::Key((JSONWriter *)paVar1,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  JSONWriter::SimpleValue<aiString>((JSONWriter *)ai_local,&paStack_18->mName);
  paVar1 = ai_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"type",&local_79);
  JSONWriter::Key((JSONWriter *)paVar1,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  JSONWriter::SimpleValue<aiLightSourceType>((JSONWriter *)ai_local,&paStack_18->mType);
  paVar1 = ai_local;
  if ((paStack_18->mType == aiLightSource_SPOT) || (paStack_18->mType == aiLightSource_UNDEFINED)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a0,"angleinnercone",&local_a1);
    JSONWriter::Key((JSONWriter *)paVar1,&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::allocator<char>::~allocator(&local_a1);
    JSONWriter::SimpleValue<float>((JSONWriter *)ai_local,&paStack_18->mAngleInnerCone);
    paVar1 = ai_local;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"angleoutercone",&local_c9);
    JSONWriter::Key((JSONWriter *)paVar1,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator(&local_c9);
    JSONWriter::SimpleValue<float>((JSONWriter *)ai_local,&paStack_18->mAngleOuterCone);
  }
  paVar1 = ai_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,"attenuationconstant",&local_f1);
  JSONWriter::Key((JSONWriter *)paVar1,&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator(&local_f1);
  JSONWriter::SimpleValue<float>((JSONWriter *)ai_local,&paStack_18->mAttenuationConstant);
  paVar1 = ai_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"attenuationlinear",&local_119);
  JSONWriter::Key((JSONWriter *)paVar1,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::allocator<char>::~allocator(&local_119);
  JSONWriter::SimpleValue<float>((JSONWriter *)ai_local,&paStack_18->mAttenuationLinear);
  paVar1 = ai_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_140,"attenuationquadratic",&local_141);
  JSONWriter::Key((JSONWriter *)paVar1,&local_140);
  std::__cxx11::string::~string((string *)&local_140);
  std::allocator<char>::~allocator(&local_141);
  JSONWriter::SimpleValue<float>((JSONWriter *)ai_local,&paStack_18->mAttenuationQuadratic);
  paVar1 = ai_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_168,"diffusecolor",&local_169)
  ;
  JSONWriter::Key((JSONWriter *)paVar1,&local_168);
  std::__cxx11::string::~string((string *)&local_168);
  std::allocator<char>::~allocator(&local_169);
  Write((JSONWriter *)ai_local,&paStack_18->mColorDiffuse,false);
  paVar1 = ai_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_190,"specularcolor",&local_191);
  JSONWriter::Key((JSONWriter *)paVar1,&local_190);
  std::__cxx11::string::~string((string *)&local_190);
  std::allocator<char>::~allocator(&local_191);
  Write((JSONWriter *)ai_local,&paStack_18->mColorSpecular,false);
  paVar1 = ai_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b8,"ambientcolor",&local_1b9)
  ;
  JSONWriter::Key((JSONWriter *)paVar1,&local_1b8);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::allocator<char>::~allocator(&local_1b9);
  Write((JSONWriter *)ai_local,&paStack_18->mColorAmbient,false);
  paVar1 = ai_local;
  if (paStack_18->mType != aiLightSource_POINT) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e0,"direction",&local_1e1);
    JSONWriter::Key((JSONWriter *)paVar1,&local_1e0);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::allocator<char>::~allocator(&local_1e1);
    Write((JSONWriter *)ai_local,&paStack_18->mDirection,false);
  }
  paVar1 = ai_local;
  if (paStack_18->mType != aiLightSource_DIRECTIONAL) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_208,"position",&local_209);
    JSONWriter::Key((JSONWriter *)paVar1,&local_208);
    std::__cxx11::string::~string((string *)&local_208);
    std::allocator<char>::~allocator(&local_209);
    Write((JSONWriter *)ai_local,&paStack_18->mPosition,false);
  }
  JSONWriter::EndObj((JSONWriter *)ai_local);
  return;
}

Assistant:

void Write(JSONWriter& out, const aiLight& ai, bool is_elem = true) {
    out.StartObj(is_elem);

    out.Key("name");
    out.SimpleValue(ai.mName);

    out.Key("type");
    out.SimpleValue(ai.mType);

    if (ai.mType == aiLightSource_SPOT || ai.mType == aiLightSource_UNDEFINED) {
        out.Key("angleinnercone");
        out.SimpleValue(ai.mAngleInnerCone);

        out.Key("angleoutercone");
        out.SimpleValue(ai.mAngleOuterCone);
    }

    out.Key("attenuationconstant");
    out.SimpleValue(ai.mAttenuationConstant);

    out.Key("attenuationlinear");
    out.SimpleValue(ai.mAttenuationLinear);

    out.Key("attenuationquadratic");
    out.SimpleValue(ai.mAttenuationQuadratic);

    out.Key("diffusecolor");
    Write(out, ai.mColorDiffuse, false);

    out.Key("specularcolor");
    Write(out, ai.mColorSpecular, false);

    out.Key("ambientcolor");
    Write(out, ai.mColorAmbient, false);

    if (ai.mType != aiLightSource_POINT) {
        out.Key("direction");
        Write(out, ai.mDirection, false);

    }

    if (ai.mType != aiLightSource_DIRECTIONAL) {
        out.Key("position");
        Write(out, ai.mPosition, false);
    }

    out.EndObj();
}